

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texio.cpp
# Opt level: O1

void __thiscall tex_sentry::tex_sentry(tex_sentry *this,string *out_file_name)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  FILE *pFVar4;
  int *piVar5;
  int pipefd [2];
  int local_20 [2];
  
  this->tex_pid = 0;
  this->tex_fo = (FILE *)0x0;
  this->state = 0;
  local_20[0] = 0;
  local_20[1] = 0;
  iVar1 = pipe(local_20);
  if (-1 < iVar1) {
    _Var2 = fork();
    this->tex_pid = _Var2;
    if (-1 < _Var2) {
      if (_Var2 == 0) {
        close(local_20[1]);
        iVar1 = open("/dev/null",1);
        iVar3 = dup2(iVar1,1);
        close(iVar1);
        if (-1 < iVar3) {
          iVar1 = dup2(local_20[0],0);
          close(local_20[0]);
          if (-1 < iVar1) {
            execlp("pdflatex","pdflatex","-jobname",(out_file_name->_M_dataplus)._M_p,0);
          }
        }
        exit(1);
      }
      close(local_20[0]);
      pFVar4 = fdopen(local_20[1],"w");
      this->tex_fo = (FILE *)pFVar4;
      if (pFVar4 != (FILE *)0x0) {
        return;
      }
    }
  }
  piVar5 = __errno_location();
  this->state = *piVar5;
  return;
}

Assistant:

tex_sentry::tex_sentry(const std::string& out_file_name) : tex_pid(0), tex_fo(nullptr), state(0)
{
    int pipefd[2] = {};
    if (pipe(pipefd) < 0) {
        state = errno;
        return;
    }
    tex_pid = fork();
    if (tex_pid < 0) { // Fork was not sucessful
        state = errno;
        return;
    } else if (tex_pid == 0) { // Child section
        close(pipefd[1]);
        int trash_fd = open("/dev/null", O_WRONLY);
        int tex_outputfd = dup2(trash_fd, STDOUT_FILENO);
        if (tex_outputfd < 0) {
            close(trash_fd);
            exit(1);
        }
        close(trash_fd);
        int tex_inputfd = dup2(pipefd[0], STDIN_FILENO);
        if (tex_inputfd < 0) {
            close(pipefd[0]);
            exit(1);
        }
        close(pipefd[0]);
        execlp("pdflatex", "pdflatex", "-jobname", out_file_name.c_str(), nullptr);
        exit(1);
    } // End of child section
    close(pipefd[0]);
    tex_fo = fdopen(pipefd[1], "w");
    if (tex_fo == nullptr)
        state = errno;
}